

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.h
# Opt level: O0

void Abc_NodeSetTravId(Abc_Obj_t *p,int TravId)

{
  uint i;
  Abc_Ntk_t *pAVar1;
  int TravId_local;
  Abc_Obj_t *p_local;
  
  pAVar1 = Abc_ObjNtk(p);
  i = Abc_ObjId(p);
  Vec_IntSetEntry(&pAVar1->vTravIds,i,TravId);
  return;
}

Assistant:

static inline void        Abc_NodeSetTravId( Abc_Obj_t * p, int TravId )    { Vec_IntSetEntry(&Abc_ObjNtk(p)->vTravIds, Abc_ObjId(p), TravId );                     }